

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O0

SENode * __thiscall spvtools::opt::SENodeSimplifyImpl::SimplifyPolynomial(SENodeSimplifyImpl *this)

{
  bool bVar1;
  int iVar2;
  pointer pSVar3;
  ScalarEvolutionAnalysis *pSVar4;
  SENode *pSVar5;
  SERecurrentNode *pSVar6;
  ChildContainerType *pCVar7;
  size_type sVar8;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_68;
  undefined4 local_5c;
  SENode *local_58;
  SENode *count_as_constant;
  int64_t count;
  SENode *term;
  pair<spvtools::opt::SENode_*const,_long> *pair;
  iterator __end2;
  iterator __begin2;
  map<spvtools::opt::SENode_*,_long,_std::less<spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*const,_long>_>_>
  *__range2;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> new_add;
  SENodeSimplifyImpl *this_local;
  
  new_add._M_t.
  super___uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
  super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>,_true,_true>
          )this;
  pSVar3 = (pointer)operator_new(0x30);
  pSVar4 = SENode::GetParentAnalysis(this->node_);
  SEAddNode::SEAddNode((SEAddNode *)pSVar3,pSVar4);
  std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
  unique_ptr<std::default_delete<spvtools::opt::SENode>,void>
            ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
             &__range2,pSVar3);
  pSVar3 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::get
                     ((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                       *)&__range2);
  GatherAccumulatorsFromChildNodes(this,pSVar3,this->node_,false);
  if (this->constant_accumulator_ != 0) {
    pSVar3 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
             operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                         *)&__range2);
    pSVar5 = ScalarEvolutionAnalysis::CreateConstant(this->analysis_,this->constant_accumulator_);
    (*pSVar3->_vptr_SENode[3])(pSVar3,pSVar5);
  }
  __end2 = std::
           map<spvtools::opt::SENode_*,_long,_std::less<spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*const,_long>_>_>
           ::begin(&this->accumulators_);
  pair = (pair<spvtools::opt::SENode_*const,_long> *)
         std::
         map<spvtools::opt::SENode_*,_long,_std::less<spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*const,_long>_>_>
         ::end(&this->accumulators_);
  do {
    bVar1 = std::operator!=(&__end2,(_Self *)&pair);
    if (!bVar1) {
      pSVar3 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
               operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                           *)&__range2);
      pCVar7 = SENode::GetChildren(pSVar3);
      sVar8 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::size
                        (pCVar7);
      if (sVar8 == 1) {
        pSVar3 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                 ::operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                               *)&__range2);
        this_local = (SENodeSimplifyImpl *)SENode::GetChild(pSVar3,0);
      }
      else {
        pSVar3 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                 ::operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                               *)&__range2);
        pCVar7 = SENode::GetChildren(pSVar3);
        sVar8 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::size
                          (pCVar7);
        if (sVar8 == 0) {
          this_local = (SENodeSimplifyImpl *)
                       ScalarEvolutionAnalysis::CreateConstant(this->analysis_,0);
        }
        else {
          pSVar4 = this->analysis_;
          std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
          unique_ptr(&local_68,
                     (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                      *)&__range2);
          this_local = (SENodeSimplifyImpl *)
                       ScalarEvolutionAnalysis::GetCachedOrAdd(pSVar4,&local_68);
          std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
          ~unique_ptr(&local_68);
        }
      }
      local_5c = 1;
      std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
      ~unique_ptr((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> *)
                  &__range2);
      return (SENode *)this_local;
    }
    term = (SENode *)
           std::_Rb_tree_iterator<std::pair<spvtools::opt::SENode_*const,_long>_>::operator*
                     (&__end2);
    count = (int64_t)term->_vptr_SENode;
    count_as_constant =
         (SENode *)
         (term->children_).
         super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    if (count_as_constant != (SENode *)0x0) {
      if (count_as_constant == (SENode *)0x1) {
        pSVar3 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                 ::operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                               *)&__range2);
        (*pSVar3->_vptr_SENode[3])(pSVar3,count);
      }
      else if ((count_as_constant == (SENode *)0xffffffffffffffff) &&
              (iVar2 = (**((SENode *)count)->_vptr_SENode)(), iVar2 != 1)) {
        pSVar3 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                 ::operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                               *)&__range2);
        pSVar5 = ScalarEvolutionAnalysis::CreateNegation(this->analysis_,(SENode *)count);
        (*pSVar3->_vptr_SENode[3])(pSVar3,pSVar5);
      }
      else {
        iVar2 = (*(code *)**(undefined8 **)count)();
        if (iVar2 == 5) {
          local_58 = ScalarEvolutionAnalysis::CreateConstant
                               (this->analysis_,(int64_t)count_as_constant);
          pSVar3 = std::
                   unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
                   operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                               *)&__range2);
          pSVar5 = ScalarEvolutionAnalysis::CreateMultiplyNode
                             (this->analysis_,local_58,(SENode *)count);
          (*pSVar3->_vptr_SENode[3])(pSVar3,pSVar5);
        }
        else {
          iVar2 = (*(code *)**(undefined8 **)count)();
          if (iVar2 != 1) {
            __assert_fail("term->GetType() == SENode::RecurrentAddExpr && \"We only handle value unknowns or recurrent expressions\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_analysis_simplification.cpp"
                          ,0x15e,"SENode *spvtools::opt::SENodeSimplifyImpl::SimplifyPolynomial()");
          }
          pSVar3 = std::
                   unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
                   operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                               *)&__range2);
          pSVar6 = (SERecurrentNode *)(**(code **)(*(long *)count + 0x30))();
          pSVar6 = UpdateCoefficient(this,pSVar6,(int64_t)count_as_constant);
          (*pSVar3->_vptr_SENode[3])(pSVar3,pSVar6);
        }
      }
    }
    std::_Rb_tree_iterator<std::pair<spvtools::opt::SENode_*const,_long>_>::operator++(&__end2);
  } while( true );
}

Assistant:

SENode* SENodeSimplifyImpl::SimplifyPolynomial() {
  std::unique_ptr<SENode> new_add{new SEAddNode(node_->GetParentAnalysis())};

  // Traverse the graph and gather the accumulators from it.
  GatherAccumulatorsFromChildNodes(new_add.get(), node_, false);

  // Fold all the constants into a single constant node.
  if (constant_accumulator_ != 0) {
    new_add->AddChild(analysis_.CreateConstant(constant_accumulator_));
  }

  for (auto& pair : accumulators_) {
    SENode* term = pair.first;
    int64_t count = pair.second;

    // We can eliminate the term completely.
    if (count == 0) continue;

    if (count == 1) {
      new_add->AddChild(term);
    } else if (count == -1 && term->GetType() != SENode::RecurrentAddExpr) {
      // If the count is -1 we can just add a negative version of that node,
      // unless it is a recurrent expression as we would rather the negative
      // goes on the recurrent expressions children. This makes it easier to
      // work with in other places.
      new_add->AddChild(analysis_.CreateNegation(term));
    } else {
      // Output value unknown terms as count*term and output recurrent
      // expression terms as rec(offset, coefficient + count) offset and
      // coefficient are the same as in the original expression.
      if (term->GetType() == SENode::ValueUnknown) {
        SENode* count_as_constant = analysis_.CreateConstant(count);
        new_add->AddChild(
            analysis_.CreateMultiplyNode(count_as_constant, term));
      } else {
        assert(term->GetType() == SENode::RecurrentAddExpr &&
               "We only handle value unknowns or recurrent expressions");

        // Create a new recurrent expression by adding the count to the
        // coefficient of the old one.
        new_add->AddChild(UpdateCoefficient(term->AsSERecurrentNode(), count));
      }
    }
  }

  // If there is only one term in the addition left just return that term.
  if (new_add->GetChildren().size() == 1) {
    return new_add->GetChild(0);
  }

  // If there are no terms left in the addition just return 0.
  if (new_add->GetChildren().size() == 0) {
    return analysis_.CreateConstant(0);
  }

  return analysis_.GetCachedOrAdd(std::move(new_add));
}